

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O2

void jpeg_gen_optimal_table(j_compress_ptr cinfo,JHUFF_TBL *htbl,long *freq)

{
  UINT8 *pUVar1;
  jpeg_error_mgr *pjVar2;
  int iVar3;
  int iVar4;
  UINT8 *pUVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  UINT8 *pUVar10;
  long lVar11;
  undefined8 uStack_870;
  UINT8 bits [33];
  int codesize [257];
  int others [257];
  
  bits[0] = '\0';
  bits[1] = '\0';
  bits[2] = '\0';
  bits[3] = '\0';
  bits[4] = '\0';
  bits[5] = '\0';
  bits[6] = '\0';
  bits[7] = '\0';
  bits[8] = '\0';
  bits[9] = '\0';
  bits[10] = '\0';
  bits[0xb] = '\0';
  bits[0xc] = '\0';
  bits[0xd] = '\0';
  bits[0xe] = '\0';
  bits[0xf] = '\0';
  bits[0x10] = '\0';
  bits[0x11] = '\0';
  bits[0x12] = '\0';
  bits[0x13] = '\0';
  bits[0x14] = '\0';
  bits[0x15] = '\0';
  bits[0x16] = '\0';
  bits[0x17] = '\0';
  bits[0x18] = '\0';
  bits[0x19] = '\0';
  bits[0x1a] = '\0';
  bits[0x1b] = '\0';
  bits[0x1c] = '\0';
  bits[0x1d] = '\0';
  bits[0x1e] = '\0';
  bits[0x1f] = '\0';
  bits[0x20] = '\0';
  uStack_870 = 0x115012;
  memset(codesize,0,0x404);
  for (lVar11 = 0; lVar11 != 0x101; lVar11 = lVar11 + 1) {
    others[lVar11] = -1;
  }
  freq[0x100] = 1;
  while( true ) {
    lVar11 = 1000000000;
    uVar8 = 0xffffffff;
    for (uVar6 = 0; uVar6 != 0x101; uVar6 = uVar6 + 1) {
      lVar9 = freq[uVar6];
      if (lVar9 <= lVar11 && lVar9 != 0) {
        uVar8 = uVar6 & 0xffffffff;
        lVar11 = lVar9;
      }
    }
    lVar11 = 1000000000;
    uVar6 = 0xffffffff;
    for (uVar7 = 0; uVar7 != 0x101; uVar7 = uVar7 + 1) {
      lVar9 = freq[uVar7];
      if ((uVar8 != uVar7 && lVar9 != 0) && lVar9 <= lVar11) {
        uVar6 = uVar7 & 0xffffffff;
        lVar11 = lVar9;
      }
    }
    if ((int)uVar6 < 0) break;
    lVar11 = (long)(int)uVar8;
    freq[lVar11] = freq[lVar11] + freq[uVar6];
    freq[uVar6] = 0;
    do {
      codesize[lVar11] = codesize[lVar11] + 1;
      iVar3 = (int)uVar8;
      lVar11 = (long)others[iVar3];
      uVar8 = (ulong)(uint)others[iVar3];
    } while (-1 < lVar11);
    others[iVar3] = (int)uVar6;
    uVar8 = uVar6;
    do {
      codesize[uVar8] = codesize[uVar8] + 1;
      uVar8 = (ulong)others[uVar6];
      uVar6 = (ulong)(uint)others[uVar6];
    } while (-1 < (long)uVar8);
  }
  for (lVar11 = 0; lVar11 != 0x101; lVar11 = lVar11 + 1) {
    iVar3 = codesize[lVar11];
    if ((long)iVar3 != 0) {
      if (0x20 < iVar3) {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 0x28;
        uStack_870 = 0x115127;
        (*pjVar2->error_exit)((j_common_ptr)cinfo);
      }
      bits[iVar3] = bits[iVar3] + '\x01';
    }
  }
  lVar11 = 0x2000000000;
  pUVar5 = bits + 0x1f;
  uVar8 = 0x20;
  while (0x10 < uVar8) {
    while (lVar9 = lVar11, pUVar10 = pUVar5, bits[uVar8] != '\0') {
      do {
        lVar9 = lVar9 + -0x100000000;
        pUVar1 = pUVar10 + -1;
        pUVar10 = pUVar10 + -1;
      } while (*pUVar1 == '\0');
      bits[uVar8] = bits[uVar8] + 0xfe;
      bits[uVar8 - 1] = bits[uVar8 - 1] + '\x01';
      bits[lVar9 >> 0x20] = bits[lVar9 >> 0x20] + '\x02';
      *pUVar10 = *pUVar10 + 0xff;
    }
    pUVar5 = pUVar5 + -1;
    lVar11 = lVar11 + -0x100000000;
    uVar8 = uVar8 - 1;
  }
  pUVar5 = bits + 0x11;
  do {
    pUVar10 = pUVar5 + -1;
    pUVar5 = pUVar5 + -1;
  } while (*pUVar10 == '\0');
  *pUVar5 = *pUVar10 + 0xff;
  htbl->bits[0x10] = bits[0x10];
  *(undefined8 *)htbl->bits = bits._0_8_;
  *(undefined8 *)(htbl->bits + 8) = bits._8_8_;
  iVar4 = 0;
  for (iVar3 = 1; iVar3 != 0x21; iVar3 = iVar3 + 1) {
    for (lVar11 = 0; lVar11 != 0x100; lVar11 = lVar11 + 1) {
      if (codesize[lVar11] == iVar3) {
        htbl->huffval[iVar4] = (UINT8)lVar11;
        iVar4 = iVar4 + 1;
      }
    }
  }
  htbl->sent_table = 0;
  return;
}

Assistant:

LOCAL(void)
jpeg_gen_optimal_table (j_compress_ptr cinfo, JHUFF_TBL * htbl, long freq[])
{
#define MAX_CLEN 32		/* assumed maximum initial code length */
  UINT8 bits[MAX_CLEN+1];	/* bits[k] = # of symbols with code length k */
  int codesize[257];		/* codesize[k] = code length of symbol k */
  int others[257];		/* next symbol in current branch of tree */
  int c1, c2;
  int p, i, j;
  long v;

  /* This algorithm is explained in section K.2 of the JPEG standard */

  MEMZERO(bits, SIZEOF(bits));
  MEMZERO(codesize, SIZEOF(codesize));
  for (i = 0; i < 257; i++)
    others[i] = -1;		/* init links to empty */
  
  freq[256] = 1;		/* make sure 256 has a nonzero count */
  /* Including the pseudo-symbol 256 in the Huffman procedure guarantees
   * that no real symbol is given code-value of all ones, because 256
   * will be placed last in the largest codeword category.
   */

  /* Huffman's basic algorithm to assign optimal code lengths to symbols */

  for (;;) {
    /* Find the smallest nonzero frequency, set c1 = its symbol */
    /* In case of ties, take the larger symbol number */
    c1 = -1;
    v = 1000000000L;
    for (i = 0; i <= 256; i++) {
      if (freq[i] && freq[i] <= v) {
	v = freq[i];
	c1 = i;
      }
    }

    /* Find the next smallest nonzero frequency, set c2 = its symbol */
    /* In case of ties, take the larger symbol number */
    c2 = -1;
    v = 1000000000L;
    for (i = 0; i <= 256; i++) {
      if (freq[i] && freq[i] <= v && i != c1) {
	v = freq[i];
	c2 = i;
      }
    }

    /* Done if we've merged everything into one frequency */
    if (c2 < 0)
      break;
    
    /* Else merge the two counts/trees */
    freq[c1] += freq[c2];
    freq[c2] = 0;

    /* Increment the codesize of everything in c1's tree branch */
    codesize[c1]++;
    while (others[c1] >= 0) {
      c1 = others[c1];
      codesize[c1]++;
    }
    
    others[c1] = c2;		/* chain c2 onto c1's tree branch */
    
    /* Increment the codesize of everything in c2's tree branch */
    codesize[c2]++;
    while (others[c2] >= 0) {
      c2 = others[c2];
      codesize[c2]++;
    }
  }

  /* Now count the number of symbols of each code length */
  for (i = 0; i <= 256; i++) {
    if (codesize[i]) {
      /* The JPEG standard seems to think that this can't happen, */
      /* but I'm paranoid... */
      if (codesize[i] > MAX_CLEN)
	ERREXIT(cinfo, JERR_HUFF_CLEN_OVERFLOW);

      bits[codesize[i]]++;
    }
  }

  /* JPEG doesn't allow symbols with code lengths over 16 bits, so if the pure
   * Huffman procedure assigned any such lengths, we must adjust the coding.
   * Here is what the JPEG spec says about how this next bit works:
   * Since symbols are paired for the longest Huffman code, the symbols are
   * removed from this length category two at a time.  The prefix for the pair
   * (which is one bit shorter) is allocated to one of the pair; then,
   * skipping the BITS entry for that prefix length, a code word from the next
   * shortest nonzero BITS entry is converted into a prefix for two code words
   * one bit longer.
   */
  
  for (i = MAX_CLEN; i > 16; i--) {
    while (bits[i] > 0) {
      j = i - 2;		/* find length of new prefix to be used */
      while (bits[j] == 0)
	j--;
      
      bits[i] -= 2;		/* remove two symbols */
      bits[i-1]++;		/* one goes in this length */
      bits[j+1] += 2;		/* two new symbols in this length */
      bits[j]--;		/* symbol of this length is now a prefix */
    }
  }

  /* Remove the count for the pseudo-symbol 256 from the largest codelength */
  while (bits[i] == 0)		/* find largest codelength still in use */
    i--;
  bits[i]--;
  
  /* Return final symbol counts (only for lengths 0..16) */
  MEMCOPY(htbl->bits, bits, SIZEOF(htbl->bits));
  
  /* Return a list of the symbols sorted by code length */
  /* It's not real clear to me why we don't need to consider the codelength
   * changes made above, but the JPEG spec seems to think this works.
   */
  p = 0;
  for (i = 1; i <= MAX_CLEN; i++) {
    for (j = 0; j <= 255; j++) {
      if (codesize[j] == i) {
	htbl->huffval[p] = (UINT8) j;
	p++;
      }
    }
  }

  /* Set sent_table FALSE so updated table will be written to JPEG file. */
  htbl->sent_table = FALSE;
}